

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

int prf_array_find_ptr(void *id,void *elem)

{
  array *paVar1;
  long in_RSI;
  void *in_RDI;
  void **ptr;
  int n;
  int i;
  int local_1c;
  
  paVar1 = id_to_array(in_RDI);
  local_1c = 0;
  while( true ) {
    if ((int)(*(uint *)&paVar1->field_0x4 >> 4) <= local_1c) {
      return -1;
    }
    if (*(long *)((long)in_RDI + (long)local_1c * 8) == in_RSI) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int 
prf_array_find_ptr(void *id, void *elem)
{
  int i,n;
  void **ptr;

  n = id_to_array(id)->numelem;
  ptr = (void**)id;

  for (i = 0; i < n; i++) if (ptr[i] == elem) return i;
  return -1;
}